

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextEngineRichTextTests.cpp
# Opt level: O0

void __thiscall
agge::tests::TextEngineRichTextTests::TextEngineRichTextTests(TextEngineRichTextTests *this)

{
  TextEngineRichTextTests *this_local;
  
  ut::
  test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__SingleLineTextIsAlignedAccordinglyToRequest_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__SingleLineTextIsAlignedAccordinglyToRequest_meta>
              *)this);
  ut::
  test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__MultilineRichTextIsDrawnAccordinglyToRectAndPosition_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__MultilineRichTextIsDrawnAccordinglyToRectAndPosition_meta>
              *)&this->field_0x1);
  ut::
  test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__LayoutIsLimitedWhenRenderingTextIntoRect_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::TextEngineRichTextTests,_&agge::tests::TextEngineRichTextTests::__LayoutIsLimitedWhenRenderingTextIntoRect_meta>
              *)&this->field_0x2);
  return;
}

Assistant:

test( SingleLineTextIsAlignedAccordinglyToRequest )
			{
				mocks::font_accessor::char_to_index indices[] = {	{ L'a', 0 }, { L's', 1 }, { L't', 2 }	};
				mocks::font_accessor::glyph glyphs[] = {
					mocks::glyph(5.2, 0, c_outline_1),
					mocks::glyph(13.7, 0, c_outline_2),
					mocks::glyph(7.725, 0, c_outline_diamond),
				};
				pair<font_descriptor, mocks::font_accessor> fonts[] = {
					make_pair(font_descriptor::create("Arial", 10, regular, false, hint_strong),
						mocks::font_accessor(c_fm1, indices, glyphs)),
				};
				mocks::fonts_loader loader(fonts);
				text_engine<rasterizer_t> e(loader, 4);
				font::ptr fnt = e.create_font(fonts[0].first);
				layout l;
				rasterizer_t target, reference;

				// positions: 0.0f, 5.2f, 18.9f, 26.625f, width: 34.35f
				l.process(simple_richtext("astt", "Arial", 10, regular, false, hint_strong), limit::none(), e);

				// ACT
				e.render(target, l, align_near, align_near, create_rect(17.32f, 190.0f, 50.0f, 250.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(17.32f + 0.0f), decimate<4>(195.1f)));
				add_path(reference, offset(fnt->get_glyph(1)->get_outline(), decimate<4>(17.32f + 5.2f), decimate<4>(195.1f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(17.32f + 18.9f), decimate<4>(195.1f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(17.32f + 26.625f), decimate<4>(195.1f)));
				assert_equal(reference, target);

				// INIT
				reference.reset(), target.reset();

				// positions: 0.0f, 5.2f, 12.925f, width: 20.65f
				l.process(simple_richtext("att", "Arial", 10, regular, false, hint_strong), limit::none(), e);

				// ACT
				e.render(target, l, align_far, align_near, create_rect(17.32f, 191.05f, 50.0f, 250.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(29.35f + 0.0f), decimate<4>(196.15f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(29.35f + 5.2f), decimate<4>(196.15f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(29.35f + 12.925f), decimate<4>(196.15f)));
				assert_equal(reference, target);

				// ACT
				e.render(target, l, align_far, align_far, create_rect(17.32f, 191.05f, 50.0f, 250.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(29.35f + 0.0f), decimate<4>(247.8f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(29.35f + 5.2f), decimate<4>(247.8f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(29.35f + 12.925f), decimate<4>(247.8f)));
				assert_equal(reference, target);

				// ACT
				e.render(target, l, align_near, align_far, create_rect(0.3f, 191.05f, 50.0f, 250.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(0.3f + 0.0f), decimate<4>(247.8f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(0.3f + 5.2f), decimate<4>(247.8f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(0.3f + 12.925f), decimate<4>(247.8f)));
				assert_equal(reference, target);

				// ACT
				e.render(target, l, align_near, align_center, create_rect(0.3f, 191.05f, 50.0f, 250.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(0.3f + 0.0f), decimate<4>(221.975f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(0.3f + 5.2f), decimate<4>(221.975f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(0.3f + 12.925f), decimate<4>(221.975f)));
				assert_equal(reference, target);

				// ACT
				e.render(target, l, align_center, align_center, create_rect(0.3f, 191.05f, 50.0f, 252.0f));

				// ASSERT
				add_path(reference, offset(fnt->get_glyph(0)->get_outline(), decimate<4>(14.825f + 0.0f), decimate<4>(222.975f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(14.825f + 5.2f), decimate<4>(222.975f)));
				add_path(reference, offset(fnt->get_glyph(2)->get_outline(), decimate<4>(14.825f + 12.925f), decimate<4>(222.975f)));
				assert_equal(reference, target);
			}